

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

bool __thiscall Catch::RunContext::testForMissingAssertions(RunContext *this,Counts *assertions)

{
  uint64_t *puVar1;
  ITracker *pIVar2;
  bool bVar3;
  int iVar4;
  
  if (assertions->failed + assertions->passed + assertions->failedButOk + assertions->skipped == 0)
  {
    iVar4 = (*this->m_config->_vptr_IConfig[6])();
    if (((char)iVar4 == '\0') ||
       (pIVar2 = (this->m_trackerContext).m_currentTracker,
       (pIVar2->m_children).
       super__Vector_base<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       (pIVar2->m_children).
       super__Vector_base<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)) {
      bVar3 = false;
    }
    else {
      puVar1 = &(this->m_totals).assertions.failed;
      *puVar1 = *puVar1 + 1;
      assertions->failed = assertions->failed + 1;
      bVar3 = true;
    }
    return bVar3;
  }
  return false;
}

Assistant:

std::uint64_t Counts::total() const {
        return passed + failed + failedButOk + skipped;
    }